

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void al_set_new_display_adapter(int adapter)

{
  long lVar1;
  long *plVar2;
  
  plVar2 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar2 == 0) {
    *plVar2 = (long)(plVar2 + 1);
    initialize_tls_values((thread_local_state *)(plVar2 + 1));
  }
  lVar1 = *plVar2;
  if (lVar1 != 0) {
    if (adapter < 0) {
      *(undefined4 *)(lVar1 + 8) = 0xffffffff;
    }
    *(int *)(lVar1 + 8) = adapter;
  }
  return;
}

Assistant:

void al_set_new_display_adapter(int adapter)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;

   if (adapter < 0) {
      tls->new_display_adapter = ALLEGRO_DEFAULT_DISPLAY_ADAPTER;
   }
   tls->new_display_adapter = adapter;
}